

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O2

void ecs_snapshot_free(ecs_snapshot_t *snapshot)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  ecs_sparse_free(snapshot->entity_index);
  pvVar2 = _ecs_vector_first(snapshot->tables,0x18,0x10);
  uVar1 = ecs_vector_count(snapshot->tables);
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    ecs_table_clear_data
              (snapshot->world,*(ecs_table_t **)((long)pvVar2 + uVar4),
               *(ecs_data_t **)((long)pvVar2 + uVar4 + 0x10));
    (*ecs_os_api.free_)(*(void **)((long)pvVar2 + uVar4 + 0x10));
  }
  ecs_vector_free(snapshot->tables);
  (*ecs_os_api.free_)(snapshot);
  return;
}

Assistant:

void ecs_snapshot_free(
    ecs_snapshot_t *snapshot)
{
    ecs_sparse_free(snapshot->entity_index);

    ecs_table_leaf_t *tables = ecs_vector_first(snapshot->tables, ecs_table_leaf_t);
    int32_t i, count = ecs_vector_count(snapshot->tables);
    for (i = 0; i < count; i ++) {
        ecs_table_leaf_t *leaf = &tables[i];
        ecs_table_clear_data(snapshot->world, leaf->table, leaf->data);
        ecs_os_free(leaf->data);
    }    

    ecs_vector_free(snapshot->tables);
    ecs_os_free(snapshot);
}